

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_strmap.c
# Opt level: O1

char * dino_strmap_get_value(str_map_t *map,char *key)

{
  ulong uVar1;
  pair_t *ppVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = "";
  if (key != (char *)0x0 && map != (str_map_t *)0x0) {
    cVar3 = *key;
    if (cVar3 == '\0') {
      uVar1 = 0x1505;
    }
    else {
      pcVar4 = key + 1;
      uVar1 = 0x1505;
      do {
        uVar1 = (long)cVar3 + uVar1 * 0x21;
        cVar3 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar3 != '\0');
    }
    ppVar2 = get_pair(map->buckets + uVar1 % (ulong)map->count,key);
    if (ppVar2 != (pair_t *)0x0) {
      pcVar5 = ppVar2->value;
    }
  }
  return pcVar5;
}

Assistant:

const char *dino_strmap_get_value(const str_map_t *map, const char *key) {
    if (NULL == map || NULL == key) {
        return "";
    }

    unsigned int index = (unsigned int) (hash(key) % map->count);
    bucket_t *bucket = &(map->buckets[index]);
    pair_t *pair = get_pair(bucket, key);
    if (NULL == pair) {
        return "";
    }

    return pair->value;
}